

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

InvalidTimingControl * __thiscall
slang::BumpAllocator::emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
          (BumpAllocator *this,TimingControl **args)

{
  TimingControl *pTVar1;
  InvalidTimingControl *pIVar2;
  
  pIVar2 = (InvalidTimingControl *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InvalidTimingControl *)this->endPtr < pIVar2 + 1) {
    pIVar2 = (InvalidTimingControl *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pIVar2 + 1);
  }
  pTVar1 = *args;
  (pIVar2->super_TimingControl).kind = Invalid;
  (pIVar2->super_TimingControl).syntax = (SyntaxNode *)0x0;
  (pIVar2->super_TimingControl).sourceRange.startLoc = (SourceLocation)0x0;
  (pIVar2->super_TimingControl).sourceRange.endLoc = (SourceLocation)0x0;
  pIVar2->child = pTVar1;
  return pIVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }